

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::X86RAPass::annotate(X86RAPass *this)

{
  int iVar1;
  undefined4 extraout_var;
  long in_RDI;
  CBInst *node;
  uint32_t maxLen;
  StringBuilderTmp<256UL> sb;
  Zone *dataZone;
  CBNode *end;
  CBNode *node_;
  CCFunc *func;
  undefined4 in_stack_fffffffffffffd9c;
  Detail *in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  CodeEmitter *emitter;
  uint *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  uint32_t in_stack_fffffffffffffdd0;
  anon_union_4_2_424c626f_for_ArchInfo_0 local_21c;
  long local_218;
  uint local_20c;
  CodeEmitter local_208 [2];
  Zone *local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  CodeEmitter *local_b8;
  long local_98;
  CodeEmitter *local_90;
  undefined8 local_88;
  long local_80;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  CodeEmitter *local_38;
  CodeEmitter *local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined1 *local_10;
  CodeEmitter *local_8;
  
  local_d0 = *(long *)(in_RDI + 0x80);
  local_d8 = *(long *)(local_d0 + 0x148);
  local_e0 = (Zone *)(*(long *)(in_RDI + 8) + 0x98);
  local_b8 = local_208;
  local_10 = &NoInit;
  local_208[0]._vptr_CodeEmitter = (_func_int **)&local_208[0]._nextEmitter;
  local_208[0]._nextEmitter._0_1_ = 0;
  local_208[0]._codeInfo._archInfo.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  local_208[0]._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  local_208[0]._codeInfo._baseAddress = 0x100;
  local_208[0]._code = (CodeHolder *)0x0;
  local_20c = 0;
  local_c8 = local_d0;
  local_50 = local_d0;
  local_8 = local_b8;
  for (; local_d0 != 0 && local_d0 != local_d8; local_d0 = *(long *)(local_d0 + 8)) {
    local_48 = local_d0;
    if ((*(long *)(local_d0 + 0x18) == 0) &&
       (local_68 = local_d0, *(char *)(local_d0 + 0x10) == '\x01')) {
      local_218 = local_d0;
      local_98 = *(long *)(in_RDI + 8);
      local_20 = local_98 + 8;
      local_40 = local_d0;
      local_60 = local_d0;
      local_58 = local_d0;
      emitter = local_208;
      local_28 = local_98;
      local_18 = local_20;
      Logging::formatInstruction
                ((StringBuilder *)
                 CONCAT17(local_d0 != 0 && local_d0 != local_d8,in_stack_fffffffffffffdc0),
                 (uint32_t)((ulong)in_stack_fffffffffffffdb8 >> 0x20),emitter,
                 (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),in_stack_fffffffffffffda0,
                 (Operand_ *)CONCAT44(in_stack_fffffffffffffd9c,(uint)*(byte *)(local_d0 + 0x11)),
                 in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffda8 = local_d0;
      local_90 = emitter;
      local_30 = emitter;
      iVar1 = Zone::dup(local_e0,(int)emitter->_vptr_CodeEmitter);
      local_88 = CONCAT44(extraout_var,iVar1);
      *(undefined8 *)(in_stack_fffffffffffffda8 + 0x18) = local_88;
      local_21c = (emitter->_codeInfo)._archInfo.field_0;
      local_80 = in_stack_fffffffffffffda8;
      local_38 = emitter;
      in_stack_fffffffffffffdb8 = std::max<unsigned_int>(&local_20c,&local_21c._signature);
      local_20c = *in_stack_fffffffffffffdb8;
      StringBuilder::clear((StringBuilder *)local_208);
    }
    local_70 = local_d0;
  }
  *(uint *)(in_RDI + 0x120) = local_20c + 1;
  StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x2694a0);
  return 0;
}

Assistant:

Error X86RAPass::annotate() {
#if !defined(ASMJIT_DISABLE_LOGGING)
  CCFunc* func = getFunc();

  CBNode* node_ = func;
  CBNode* end = func->getEnd();

  Zone& dataZone = cc()->_cbDataZone;
  StringBuilderTmp<256> sb;

  uint32_t maxLen = 0;
  while (node_ && node_ != end) {
    if (!node_->hasInlineComment()) {
      if (node_->getType() == CBNode::kNodeInst) {
        CBInst* node = static_cast<CBInst*>(node_);
        Logging::formatInstruction(
          sb,
          0,
          cc(),
          cc()->getArchType(),
          node->getInstDetail(), node->getOpArray(), node->getOpCount());

        node_->setInlineComment(
          static_cast<char*>(dataZone.dup(sb.getData(), sb.getLength(), true)));
        maxLen = std::max<uint32_t>(maxLen, static_cast<uint32_t>(sb.getLength()));

        sb.clear();
      }
    }

    node_ = node_->getNext();
  }
  _annotationLength = maxLen + 1;
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}